

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfunc.cpp
# Opt level: O2

int __thiscall CVmFuncPtr::set(CVmFuncPtr *this,vm_val_t *val)

{
  uint uVar1;
  int iVar2;
  vm_bif_desc *pvVar3;
  anon_union_8_8_cb74652f_for_val *paVar4;
  vm_val_t invoker;
  
  paVar4 = &val->val;
LAB_002540fa:
  switch(val->typ) {
  case VM_CODEPTR:
    this->p_ = (uchar *)val->val;
    break;
  case VM_OBJ:
  case VM_OBJX:
    goto switchD_0025410b_caseD_5;
  default:
    goto switchD_0025410b_caseD_6;
  case VM_CODEOFS:
  case VM_FUNCPTR:
    this->p_ = (uchar *)(G_code_pool_X.super_CVmPoolPaged.pages_
                         [(val->val).obj >>
                          ((byte)G_code_pool_X.super_CVmPoolPaged.log2_page_size_ & 0x1f)].mem +
                        (G_code_pool_X.super_CVmPoolPaged._8_4_ - 1 & (val->val).obj));
    break;
  case VM_BIFPTR:
  case VM_BIFPTRX:
    pvVar3 = CVmBifTable::get_desc
                       (G_bif_table_X,(uint)(val->val).prop,(uint)(paVar4->bifptr).func_idx);
    if (pvVar3 != (vm_bif_desc *)0x0) {
      this->p_ = (uchar *)pvVar3->synth_hdr;
    }
    return (uint)(pvVar3 != (vm_bif_desc *)0x0);
  }
  return 1;
switchD_0025410b_caseD_5:
  uVar1 = (val->val).obj & 0xfff;
  iVar2 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc][uVar1].ptr_ + 0x70))
                    (G_obj_table_X.pages_[(val->val).obj >> 0xc] + uVar1,&invoker);
  paVar4 = &invoker.val;
  val = &invoker;
  if (iVar2 == 0) {
switchD_0025410b_caseD_6:
    this->p_ = (uchar *)0x0;
    return 0;
  }
  goto LAB_002540fa;
}

Assistant:

int CVmFuncPtr::set(VMG_ const vm_val_t *val)
{
    vm_val_t invoker;
    
    /* we might need to re-resolve from an invoker, so loop until resolved */
    for (;;)
    {
        /* check the type */
        switch (val->typ)
        {
        case VM_OBJ:
        case VM_OBJX:
            /* object - check to see if it's invokable */
            if (vm_objp(vmg_ val->val.obj)->get_invoker(vmg_ &invoker))
            {
                /* it's invokable - re-resolve using the invoker */
                val = &invoker;
            }
            else
            {
                /* other object types are not function pointers */
                set((uchar *)0);
                return FALSE;
            }
            break;
            
        case VM_FUNCPTR:
        case VM_CODEOFS:
            /* function pointer - get the address from the code pool */
            set((const uchar *)G_code_pool->get_ptr(val->val.ofs));
            return TRUE;
            
        case VM_CODEPTR:
            /* direct code pointer - the value contains the address */
            set((const uchar *)val->val.ptr);
            return TRUE;
            
        case VM_BIFPTR:
        case VM_BIFPTRX:
            /* built-in function pointer */
            {
                /* 
                 *   decode the function set information from the value, and
                 *   look up the bif descriptor in the registration table 
                 */
                const vm_bif_desc *desc = G_bif_table->get_desc(
                    val->val.bifptr.set_idx, val->val.bifptr.func_idx);
                
                /* fail if there's no descriptor */
                if (desc == 0)
                    return FALSE;
                
                /* point to the synthetic header */
                set((const uchar *)desc->synth_hdr);
            }
            return TRUE;

        default:
            /* other types are invalid */
            set((uchar *)0);
            return FALSE;
        }
    }
}